

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::TextureSamplerCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  ostringstream buf;
  undefined1 local_190 [376];
  
  if (*(int *)((long)this + 0x84) == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               "#version 300 es\nin highp vec4 a_pos;\nin highp vec4 a_attr;\nout highp vec4 v_attr;\nvoid main ()\n{\n\tv_attr = a_attr;\n\tgl_Position = a_pos;\n}\n"
               ,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"#version 300 es\nin highp vec4 a_pos;\nin highp vec2 a_attr;\n"
               ,0x3b);
    bVar3 = *(int *)((long)this + 0x88) == 3;
    pcVar2 = "uniform highp sampler2D u_sampler;\n";
    if (bVar3) {
      pcVar2 = "uniform highp samplerCube u_sampler;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,pcVar2,(ulong)bVar3 * 2 + 0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"out mediump vec4 v_out;\nvoid main ()\n{\n",0x27);
    uVar1 = (ulong)*(uint *)((long)this + 0x88);
    if (uVar1 < 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,&DAT_01c317b8 + *(int *)(&DAT_01c317b8 + uVar1 * 4),
                 *(long *)(&DAT_01c32e18 + uVar1 * 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"\n\tgl_Position = a_pos;\n}\n",0x19);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSamplerCase::genVertexSource (void) const
{
	// vertex shader is passthrough, fragment does the calculations
	if (m_type == TYPE_FRAGMENT)
		return s_attrPassthroughVertexShaderSource;

	// vertex shader does the calculations
	std::ostringstream buf;
	buf <<	"#version 300 es\n"
			"in highp vec4 a_pos;\n"
			"in highp vec2 a_attr;\n";

	if (m_testType != TEST_TEX_COORD_CUBE)
		buf <<	"uniform highp sampler2D u_sampler;\n";
	else
		buf <<	"uniform highp samplerCube u_sampler;\n";

	buf <<	"out mediump vec4 v_out;\n"
			"void main ()\n"
			"{\n";

	if (m_testType == TEST_TEX_COORD)
		buf <<	"	v_out = textureLod(u_sampler, a_attr, 0.0);\n";
	else if (m_testType == TEST_LOD)
		buf <<	"	v_out = textureLod(u_sampler, a_attr, a_attr.x);\n";
	else if (m_testType == TEST_GRAD)
		buf <<	"	v_out = textureGrad(u_sampler, a_attr, a_attr, a_attr.yx);\n";
	else if (m_testType == TEST_TEX_COORD_CUBE)
		buf <<	"	v_out = textureLod(u_sampler, vec3(a_attr, a_attr.x + a_attr.y), 0.0);\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"\n"
			"	gl_Position = a_pos;\n"
			"}\n";

	return buf.str();
}